

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
rehash(SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
       *this)

{
  uint uVar1;
  Node *pNVar2;
  Allocator *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  Node *dst;
  ulong uVar5;
  ExprBase **value;
  
  uVar1 = this->bucketCount;
  uVar5 = (ulong)uVar1;
  pNVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  if (this->allocator == (Allocator *)0x0) {
    dst = (Node *)(*(code *)NULLC::alloc)(uVar1 << 6);
  }
  else {
    iVar4 = (*this->allocator->_vptr_Allocator[2])();
    dst = (Node *)CONCAT44(extraout_var,iVar4);
  }
  this->data = dst;
  NULLC::fillMemory(dst,0,(ulong)this->bucketCount << 5);
  this->count = 0;
  if (uVar5 != 0) {
    value = &pNVar2->value;
    do {
      if ((SynBase *)value[-1] != (SynBase *)0x0 || (TypeBase *)value[-2] != (TypeBase *)0x0) {
        insert(this,(TypedFunctionInstanceRequest *)(value + -3),value);
      }
      value = value + 4;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (pNVar2 != this->storage) {
    pAVar3 = this->allocator;
    if (pAVar3 != (Allocator *)0x0) {
      (*pAVar3->_vptr_Allocator[3])(pAVar3,pNVar2);
      return;
    }
    (*(code *)NULLC::dealloc)(pNVar2);
    return;
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		else
			data = (Node*)NULLC::alloc(sizeof(Node) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node &item = oldData[i];

			if(item.key == Key())
				continue;

			insert(item.key, item.value);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}